

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O2

void __thiscall
polyscope::render::backend_openGL_mock::GLShaderProgram::setAttribute
          (GLShaderProgram *this,string *name,vector<float,_std::allocator<float>_> *data)

{
  GLShaderProgram *pGVar1;
  element_type *peVar2;
  __type _Var3;
  invalid_argument *this_00;
  GLShaderProgram *this_01;
  GLShaderProgram *a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  a = (GLShaderProgram *)
      (this->attributes).
      super__Vector_base<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>
      ._M_impl.super__Vector_impl_data._M_start;
  pGVar1 = (GLShaderProgram *)
           (this->attributes).
           super__Vector_base<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (a == pGVar1) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+(&bStack_48,"Tried to set nonexistent attribute with name ",name);
      std::invalid_argument::invalid_argument(this_00,(string *)&bStack_48);
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    this_01 = a;
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)a,
                            name);
    if (_Var3) break;
    a = (GLShaderProgram *)&(a->super_ShaderProgram).instanceCount;
  }
  ensureBufferExists(this_01,(GLShaderAttribute *)a);
  peVar2 = (a->super_ShaderProgram).indexBuffer.
           super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  (*peVar2->_vptr_AttributeBuffer[5])(peVar2,data);
  return;
}

Assistant:

void GLShaderProgram::setAttribute(std::string name, const std::vector<float>& data) {

  // pass-through to the buffer
  for (GLShaderAttribute& a : attributes) {
    if (a.name == name) {
      ensureBufferExists(a);
      a.buff->setData(data);
      return;
    }
  }

  throw std::invalid_argument("Tried to set nonexistent attribute with name " + name);
}